

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void iadst16_stage9_ssse3(__m128i *output,__m128i *x)

{
  longlong lVar1;
  __m128i alVar2;
  
  lVar1 = (*x)[1];
  (*output)[0] = (*x)[0];
  (*output)[1] = lVar1;
  alVar2 = (__m128i)psubsw((undefined1  [16])0x0,(undefined1  [16])x[8]);
  output[1] = alVar2;
  lVar1 = x[0xc][1];
  output[2][0] = x[0xc][0];
  output[2][1] = lVar1;
  alVar2 = (__m128i)psubsw((undefined1  [16])0x0,(undefined1  [16])x[4]);
  output[3] = alVar2;
  lVar1 = x[6][1];
  output[4][0] = x[6][0];
  output[4][1] = lVar1;
  alVar2 = (__m128i)psubsw((undefined1  [16])0x0,(undefined1  [16])x[0xe]);
  output[5] = alVar2;
  lVar1 = x[10][1];
  output[6][0] = x[10][0];
  output[6][1] = lVar1;
  alVar2 = (__m128i)psubsw((undefined1  [16])0x0,(undefined1  [16])x[2]);
  output[7] = alVar2;
  lVar1 = x[3][1];
  output[8][0] = x[3][0];
  output[8][1] = lVar1;
  alVar2 = (__m128i)psubsw((undefined1  [16])0x0,(undefined1  [16])x[0xb]);
  output[9] = alVar2;
  lVar1 = x[0xf][1];
  output[10][0] = x[0xf][0];
  output[10][1] = lVar1;
  alVar2 = (__m128i)psubsw((undefined1  [16])0x0,(undefined1  [16])x[7]);
  output[0xb] = alVar2;
  lVar1 = x[5][1];
  output[0xc][0] = x[5][0];
  output[0xc][1] = lVar1;
  alVar2 = (__m128i)psubsw((undefined1  [16])0x0,(undefined1  [16])x[0xd]);
  output[0xd] = alVar2;
  lVar1 = x[9][1];
  output[0xe][0] = x[9][0];
  output[0xe][1] = lVar1;
  alVar2 = (__m128i)psubsw((undefined1  [16])0x0,(undefined1  [16])x[1]);
  output[0xf] = alVar2;
  return;
}

Assistant:

static inline void iadst16_stage9_ssse3(__m128i *output, __m128i *x) {
  const __m128i __zero = _mm_setzero_si128();
  output[0] = x[0];
  output[1] = _mm_subs_epi16(__zero, x[8]);
  output[2] = x[12];
  output[3] = _mm_subs_epi16(__zero, x[4]);
  output[4] = x[6];
  output[5] = _mm_subs_epi16(__zero, x[14]);
  output[6] = x[10];
  output[7] = _mm_subs_epi16(__zero, x[2]);
  output[8] = x[3];
  output[9] = _mm_subs_epi16(__zero, x[11]);
  output[10] = x[15];
  output[11] = _mm_subs_epi16(__zero, x[7]);
  output[12] = x[5];
  output[13] = _mm_subs_epi16(__zero, x[13]);
  output[14] = x[9];
  output[15] = _mm_subs_epi16(__zero, x[1]);
}